

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O3

ostream * operator<<(ostream *outs,RGB rgb)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)outs,(uint3)rgb & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,rgb._1_2_ & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,(uint)((uint3)rgb >> 0x10));
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, RGB rgb)
{
  outs << static_cast<int>(rgb.r) << " " << static_cast<int>(rgb.g) << " "
       << static_cast<int>(rgb.b);
  return outs;
}